

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_compute_branch1_r6
               (DisasContext_conflict6 *ctx,uint32_t op,int32_t ft,int32_t offset,int delayslot_size
               )

{
  byte *pbVar1;
  TCGContext_conflict6 *s;
  TCGTemp *a2;
  target_ulong tVar2;
  target_ulong tVar3;
  uintptr_t o;
  TCGv_i64 t;
  
  s = ctx->uc->tcg_ctx;
  a2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  t = (TCGv_i64)((long)a2 - (long)s);
  if ((ctx->hflags & 0x87f800) == 0) {
    gen_load_fpr64(ctx,t,ft);
    tcg_gen_andi_i64_mips64el(s,t,t,1);
    tVar2 = (ctx->base).pc_next + (long)offset + 4;
    tVar3 = (long)(int)tVar2;
    if ((ctx->hflags & 0x200) == 0) {
      tVar3 = tVar2;
    }
    if (op != 0x45a00000) {
      if (op != 0x45200000) goto LAB_009b1810;
      tcg_gen_xori_i64_mips64el(s,t,t,1);
    }
    pbVar1 = (byte *)((long)&ctx->hflags + 1);
    *pbVar1 = *pbVar1 | 0x10;
    if (s->bcond != t) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)(s->bcond + (long)s),(TCGArg)a2);
    }
    ctx->btarget = tVar3;
    if (delayslot_size == 4) {
      pbVar1 = (byte *)((long)&ctx->hflags + 2);
      *pbVar1 = *pbVar1 | 1;
    }
    else if (delayslot_size == 2) {
      pbVar1 = (byte *)((long)&ctx->hflags + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
  }
  else {
LAB_009b1810:
    generate_exception_err(ctx,0x14,0);
  }
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(t + (long)s));
  return;
}

Assistant:

static void gen_compute_branch1_r6(DisasContext *ctx, uint32_t op,
                                   int32_t ft, int32_t offset,
                                   int delayslot_size)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong btarget;
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);

    if (ctx->hflags & MIPS_HFLAG_BMASK) {
#ifdef MIPS_DEBUG_DISAS
        LOG_DISAS("Branch in delay / forbidden slot at PC 0x" TARGET_FMT_lx
                  "\n", ctx->base.pc_next);
#endif
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

    gen_load_fpr64(ctx, t0, ft);
    tcg_gen_andi_i64(tcg_ctx, t0, t0, 1);

    btarget = addr_add(ctx, ctx->base.pc_next + 4, offset);

    switch (op) {
    case OPC_BC1EQZ:
        tcg_gen_xori_i64(tcg_ctx, t0, t0, 1);
        ctx->hflags |= MIPS_HFLAG_BC;
        break;
    case OPC_BC1NEZ:
        /* t0 already set */
        ctx->hflags |= MIPS_HFLAG_BC;
        break;
    default:
        MIPS_INVAL("cp1 cond branch");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

    tcg_gen_trunc_i64_tl(tcg_ctx, tcg_ctx->bcond, t0);

    ctx->btarget = btarget;

    switch (delayslot_size) {
    case 2:
        ctx->hflags |= MIPS_HFLAG_BDS16;
        break;
    case 4:
        ctx->hflags |= MIPS_HFLAG_BDS32;
        break;
    }

out:
    tcg_temp_free_i64(tcg_ctx, t0);
}